

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O2

Wln_Ntk_t * Wln_NtkFromNdr(void *pData)

{
  Hash_IntMan_t *p;
  void *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Wln_Ntk_t *p_00;
  Hash_IntObj_t *pHVar5;
  int *piVar6;
  long lVar7;
  Abc_Nam_t *pAVar8;
  ulong uVar9;
  Wln_Ntk_t *pWVar10;
  uint uVar11;
  ulong uVar12;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar13;
  int Fill;
  int Fill_00;
  int Type;
  int Fill_01;
  int Count;
  int iVar14;
  int Obj;
  int iVar15;
  Wln_Vec_t *pWVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint local_ac;
  int fFound;
  int local_a4;
  void *local_a0;
  Vec_Int_t *local_98;
  int *pArray;
  int local_84;
  Vec_Int_t *local_80;
  int local_78;
  int local_74;
  int local_70;
  int Beg_1;
  int End;
  int local_64;
  ulong local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_48 = 100;
  pVVar4 = Vec_IntAlloc(100);
  local_a0 = malloc(800);
  iVar14 = 0;
  for (iVar15 = 3; iVar15 < *(int *)(*(long *)((long)pData + 0x10) + 8) + 2; iVar15 = iVar15 + iVar1
      ) {
    iVar1 = Ndr_DataType((Ndr_Data_t *)pData,iVar15);
    iVar14 = iVar14 + (uint)(iVar1 == 3);
    iVar1 = Ndr_DataSize((Ndr_Data_t *)pData,iVar15);
  }
  p_00 = Wln_NtkAlloc("top",iVar14);
  Wln_NtkCheckIntegrity(pData);
  local_98 = &p_00->vNameIds;
  local_38 = &p_00->vTypes;
  Vec_IntFill(local_98,(p_00->vTypes).nCap,Fill);
  local_40 = &p_00->vInstIds;
  Vec_IntFill(local_40,(p_00->vTypes).nCap,Fill_00);
  local_80 = pVVar4;
  for (iVar15 = 3; iVar14 = *(int *)(*(long *)((long)pData + 0x10) + 8), iVar15 < iVar14 + 2;
      iVar15 = iVar15 + iVar14) {
    iVar14 = Ndr_DataType((Ndr_Data_t *)pData,iVar15);
    if ((iVar14 == 3) && (iVar14 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar15,3), iVar14 != 0)) {
      iVar14 = Ndr_ObjGetRange((Ndr_Data_t *)pData,iVar15,&End,(int *)&pArray);
      iVar14 = Wln_ObjAlloc(p_00,3,iVar14,End,(int)pArray);
      iVar1 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,5);
      iVar2 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,7);
      Vec_IntWriteEntry(local_98,iVar14,iVar1);
      pVVar4 = local_80;
      if (0 < iVar2) {
        Vec_IntWriteEntry(local_40,iVar14,iVar2);
        pVVar4 = local_80;
      }
    }
    iVar14 = Ndr_DataSize((Ndr_Data_t *)pData,iVar15);
  }
  local_ac = 0;
  iVar15 = 3;
  do {
    if (iVar14 + 2 <= iVar15) {
      iVar15 = 3;
      do {
        if (iVar14 + 2 <= iVar15) {
          Vec_IntFree(pVVar4);
          uVar19 = (p_00->vInstIds).nSize;
          uVar12 = 0;
          uVar9 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar9 = uVar12;
          }
          iVar15 = 0;
          for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
            iVar15 = iVar15 + (uint)(0 < (p_00->vInstIds).pArray[uVar12]);
          }
          if (iVar15 == 0) {
            piVar6 = (p_00->vInstIds).pArray;
            if (piVar6 != (int *)0x0) {
              free(piVar6);
              (p_00->vInstIds).pArray = (int *)0x0;
            }
            (p_00->vInstIds).nCap = 0;
            (p_00->vInstIds).nSize = 0;
          }
          iVar15 = 0;
          pVVar4 = Vec_IntAlloc(0);
          if ((p_00->vNameIds).nSize != 0) {
            iVar14 = Vec_IntFindMax(local_98);
            Vec_IntFill(pVVar4,iVar14 + 1,Fill_01);
            for (; iVar15 < (p_00->vNameIds).nSize; iVar15 = iVar15 + 1) {
              iVar14 = Vec_IntEntry(local_98,iVar15);
              if (iVar14 != 0) {
                Vec_IntWriteEntry(pVVar4,iVar14,iVar15);
              }
            }
          }
          for (lVar7 = 1; lVar7 < (p_00->vTypes).nSize; lVar7 = lVar7 + 1) {
            pWVar16 = p_00->vFanins;
            for (lVar18 = 0; lVar18 < pWVar16[lVar7].nSize; lVar18 = lVar18 + 1) {
              iVar15 = Wln_ObjFanin(p_00,(int)lVar7,(int)lVar18);
              if (iVar15 != 0) {
                iVar15 = Vec_IntEntry(pVVar4,iVar15);
                pWVar16 = p_00->vFanins;
                paVar13 = &pWVar16[lVar7].field_2;
                if (2 < *(int *)((long)paVar13 + -4)) {
                  paVar13 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar13->pArray[0];
                }
                paVar13->Array[lVar18] = iVar15;
              }
            }
          }
          Vec_IntFree(pVVar4);
          uVar11 = Vec_IntFindMax(local_98);
          uVar19 = uVar11 + 1;
          uVar9 = (ulong)uVar19;
          if (1 < uVar19) {
            uVar9 = 0;
            for (uVar17 = uVar11; uVar17 != 0; uVar17 = uVar17 / 10) {
              uVar9 = (ulong)((int)uVar9 + 1);
            }
          }
          pAVar8 = Abc_NamStart(uVar19,10);
          p_00->pManName = pAVar8;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          uVar19 = 1;
          while( true ) {
            __ptr = local_a0;
            if (uVar19 - uVar11 == 1) {
              uVar19 = 0;
              iVar15 = 1;
              do {
                if ((p_00->vTypes).nSize <= iVar15) {
                  if (uVar19 != local_ac) {
                    __assert_fail("i == Vec_PtrSize(vConstStrings)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                                  ,0x10c,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
                  }
                  free(__ptr);
                  Wln_WriteVer(p_00,"temp_ndr.v");
                  printf("Dumped design \"%s\" into file \"temp_ndr.v\".\n",p_00->pName);
                  pWVar10 = Wln_NtkDupDfs(p_00);
                  Wln_NtkFree(p_00);
                  return pWVar10;
                }
                iVar14 = Wln_ObjIsConst(p_00,iVar15);
                if (iVar14 != 0) {
                  if (((int)uVar19 < 0) || ((int)local_ac <= (int)uVar19)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  uVar9 = (ulong)uVar19;
                  uVar19 = uVar19 + 1;
                  iVar14 = Abc_NamStrFindOrAdd(p_00->pManName,*(char **)((long)__ptr + uVar9 * 8),
                                               (int *)0x0);
                  Wln_ObjSetConst(p_00,iVar15,iVar14);
                }
                iVar15 = iVar15 + 1;
              } while( true );
            }
            sprintf((char *)&End,"s%0*d",uVar9,(ulong)uVar19);
            uVar17 = Abc_NamStrFindOrAdd(p_00->pManName,(char *)&End,&fFound);
            if ((fFound != 0) || (uVar19 != uVar17)) break;
            uVar19 = uVar19 + 1;
          }
          __assert_fail("!fFound && i == NameId",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                        ,0x105,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
        }
        iVar14 = Ndr_DataType((Ndr_Data_t *)pData,iVar15);
        if ((iVar14 == 3) && (iVar14 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar15,4), iVar14 != 0)) {
          iVar14 = Ndr_ObjGetRange((Ndr_Data_t *)pData,iVar15,&End,&fFound);
          iVar1 = Ndr_ObjReadArray((Ndr_Data_t *)pData,iVar15,4,&pArray);
          iVar14 = Wln_ObjAlloc(p_00,4,iVar14,End,fFound);
          iVar2 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,5);
          iVar3 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,7);
          if ((iVar1 != 1) || ((iVar2 != -1 || (iVar3 != -1)))) {
            __assert_fail("nArray == 1 && NameId == -1 && InstId == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                          ,0xef,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
          }
          Wln_ObjAddFanin(p_00,iVar14,*(int *)CONCAT44(pArray._4_4_,(int)pArray));
          pVVar4 = local_80;
        }
        iVar14 = Ndr_DataSize((Ndr_Data_t *)pData,iVar15);
        iVar15 = iVar15 + iVar14;
        iVar14 = *(int *)(*(long *)((long)pData + 0x10) + 8);
      } while( true );
    }
    iVar14 = Ndr_DataType((Ndr_Data_t *)pData,iVar15);
    if (((iVar14 == 3) && (iVar14 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar15,3), iVar14 == 0)) &&
       (iVar14 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar15,4), iVar14 == 0)) {
      iVar1 = Ndr_ObjGetRange((Ndr_Data_t *)pData,iVar15,&fFound,&Beg_1);
      iVar2 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,6);
      iVar14 = Ndr_ObjReadArray((Ndr_Data_t *)pData,iVar15,4,&pArray);
      local_a4 = fFound;
      local_78 = Beg_1;
      local_84 = iVar2;
      End = iVar14;
      local_64 = iVar14;
      iVar1 = Wln_ObjAlloc(p_00,iVar2,iVar1,fFound,Beg_1);
      local_74 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,5);
      local_70 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar15,7);
      pVVar4->nSize = 0;
      iVar2 = 0;
      if (iVar14 < 1) {
        iVar14 = iVar2;
      }
      for (; iVar14 != iVar2; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry((Vec_Int_t *)&End,iVar2);
        Vec_IntPush(pVVar4,iVar3);
      }
      if (local_84 == 0x58) {
        __assert_fail("Type != ABC_OPER_DFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                      ,0xd6,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
      }
      iVar14 = Vec_IntEntry(local_38,iVar1);
      if (iVar14 == 0x5b) {
        p = p_00->pRanges;
        iVar14 = p->vObjs->nSize;
        iVar2 = iVar14 / 4;
        uVar9 = (long)iVar14 % 4 & 0xffffffff;
        iVar14 = p->vTable->nSize;
        if (iVar14 < iVar2) {
          uVar19 = iVar14 * 2 - 1;
LAB_002fe131:
          do {
            uVar17 = uVar19 + 1;
            uVar11 = uVar19 & 1;
            uVar19 = uVar17;
          } while (uVar11 != 0);
          uVar11 = 3;
LAB_002fe13d:
          if (uVar11 * uVar11 <= uVar17) break;
          Vec_IntFill(p->vTable,uVar17,(int)uVar9);
          for (iVar14 = 1; iVar14 < iVar2; iVar14 = iVar14 + 1) {
            pHVar5 = Hash_IntObj(p,iVar14);
            pHVar5->iNext = 0;
            piVar6 = Hash_Int2ManLookup(p,pHVar5->iData0,pHVar5->iData1);
            if (*piVar6 != 0) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                            ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
            }
            *piVar6 = iVar14;
          }
        }
        iVar14 = local_78;
        piVar6 = Hash_Int2ManLookup(p,local_a4,local_78);
        iVar3 = *piVar6;
        if (*piVar6 == 0) {
          *piVar6 = iVar2;
          Vec_IntPush(p->vObjs,local_a4);
          Vec_IntPush(p->vObjs,iVar14);
          Vec_IntPush(p->vObjs,0);
          Vec_IntPush(p->vObjs,0);
          iVar3 = iVar2;
        }
        Wln_ObjSetSlice(p_00,iVar1,iVar3);
        pVVar4 = local_80;
      }
      else {
        iVar14 = Wln_ObjIsConst(p_00,iVar1);
        if (iVar14 != 0) {
          piVar6 = Ndr_ObjReadBodyP((Ndr_Data_t *)pData,iVar15,Type);
          uVar19 = (uint)local_48;
          if (local_ac == uVar19) {
            uVar11 = uVar19 * 2;
            if ((int)uVar19 < 0x10) {
              uVar11 = 0x10;
            }
            if ((int)uVar19 < (int)uVar11) {
              if (local_a0 == (void *)0x0) {
                local_a0 = malloc((ulong)uVar11 << 3);
              }
              else {
                local_a0 = realloc(local_a0,(ulong)uVar11 << 3);
              }
              local_48 = (ulong)uVar11;
            }
          }
          lVar7 = (long)(int)local_ac;
          local_ac = local_ac + 1;
          *(int **)((long)local_a0 + lVar7 * 8) = piVar6;
        }
      }
      Wln_ObjAddFanins(p_00,iVar1,pVVar4);
      Vec_IntWriteEntry(local_98,iVar1,local_74);
      if (0 < local_70) {
        Vec_IntWriteEntry(local_40,iVar1,local_70);
      }
      if (local_84 == 0x35) {
        if (p_00->vFanins[iVar1].nSize != 2) {
          __assert_fail("Wln_ObjFaninNum(pNtk, iObj) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                        ,0xe2,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
        }
        Wln_ObjSetSigned(p_00,p_00->vFanins[iVar1].field_2.Array[0]);
        iVar14 = Wln_ObjFanin1(p_00,iVar1);
        Wln_ObjSetSigned(p_00,iVar14);
      }
    }
    iVar14 = Ndr_DataSize((Ndr_Data_t *)pData,iVar15);
    iVar15 = iVar15 + iVar14;
    iVar14 = *(int *)(*(long *)((long)pData + 0x10) + 8);
  } while( true );
  uVar9 = (ulong)uVar17 % (ulong)uVar11;
  uVar11 = uVar11 + 2;
  if ((int)uVar9 == 0) goto LAB_002fe131;
  goto LAB_002fe13d;
}

Assistant:

Wln_Ntk_t * Wln_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    Vec_Ptr_t * vConstStrings = Vec_PtrAlloc( 100 );
    int Mod = 2, i, k, iFanin, iObj, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Wln_Ntk_t * pTemp, * pNtk = Wln_NtkAlloc( "top", Ndr_DataObjNum(p, Mod) );
    Wln_NtkCheckIntegrity( pData );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wln_NtkCleanNameId( pNtk );
    Wln_NtkCleanInstId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int iObj = Wln_ObjAlloc( pNtk, ABC_OPER_CI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wln_ObjAlloc( pNtk, Type, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        assert( Type != ABC_OPER_DFF );
        if ( Wln_ObjIsSlice(pNtk, iObj) )
            Wln_ObjSetSlice( pNtk, iObj, Hash_Int2ManInsert(pNtk->pRanges, End, Beg, 0) );
        else if ( Wln_ObjIsConst(pNtk, iObj) )
            Vec_PtrPush( vConstStrings, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
//        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
//            ABC_SWAP( int, Wln_ObjFanins(pNtk, iObj)[1], Wln_ObjFanins(pNtk, iObj)[2] );
        Wln_ObjAddFanins( pNtk, iObj, vFanins );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            assert( Wln_ObjFaninNum(pNtk, iObj) == 2 );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin0(pNtk, iObj) );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin1(pNtk, iObj) );
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wln_ObjAlloc( pNtk, ABC_OPER_CO, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        assert( nArray == 1 && NameId == -1 && InstId == -1 );
        Wln_ObjAddFanin( pNtk, iObj, pArray[0] );
    }
    Vec_IntFree( vFanins );
    // remove instance names if they are not given
    //Vec_IntPrint( &pNtk->vInstIds );
    if ( Vec_IntCountPositive(&pNtk->vInstIds) == 0 )
        Vec_IntErase( &pNtk->vInstIds );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wln_NtkForEachObj( pNtk, i )
        Wln_ObjForEachFanin( pNtk, i, iFanin, k )
            Wln_ObjSetFanin( pNtk, i, k, Vec_IntEntry(vName2Obj, iFanin) );
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    // add const strings
    i = 0;
    Wln_NtkForEachObj( pNtk, iObj )
        if ( Wln_ObjIsConst(pNtk, iObj) )
            Wln_ObjSetConst( pNtk, iObj, Abc_NamStrFindOrAdd(pNtk->pManName, (char *)Vec_PtrEntry(vConstStrings, i++), NULL) );
    assert( i == Vec_PtrSize(vConstStrings) );
    Vec_PtrFree( vConstStrings );
    //Ndr_NtkPrintObjects( pNtk );
    Wln_WriteVer( pNtk, "temp_ndr.v" );
    printf( "Dumped design \"%s\" into file \"temp_ndr.v\".\n", pNtk->pName );
    // derive topological order
    pNtk = Wln_NtkDupDfs( pTemp = pNtk );
    Wln_NtkFree( pTemp );
    //Ndr_NtkPrintObjects( pNtk );
    //pNtk->fMemPorts = 1;          // the network contains memory ports
    //pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}